

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc_wrapper.cpp
# Opt level: O3

bool duckdb::Utf8Proc::CodepointToUtf8(int cp,int *sz,char *c)

{
  byte bVar1;
  
  bVar1 = (byte)cp;
  if (cp < 0x80) {
    *sz = 1;
    *c = bVar1;
  }
  else if ((uint)cp < 0x800) {
    *sz = 2;
    *c = (byte)((uint)cp >> 6) | 0xc0;
    c[1] = bVar1 & 0x3f | 0x80;
  }
  else {
    if ((cp & 0x7ffff800U) == 0xd800) {
LAB_01cc6466:
      *sz = -1;
      return false;
    }
    if ((uint)cp < 0x10000) {
      *sz = 3;
      *c = (byte)((uint)cp >> 0xc) | 0xe0;
      c[1] = (byte)((uint)cp >> 6) & 0x3f | 0x80;
      c[2] = bVar1 & 0x3f | 0x80;
    }
    else {
      if (0x10ffff < (uint)cp) goto LAB_01cc6466;
      *sz = 4;
      *c = (byte)((uint)cp >> 0x12) | 0xf0;
      c[1] = (byte)((uint)cp >> 0xc) & 0x3f | 0x80;
      c[2] = (byte)((uint)cp >> 6) & 0x3f | 0x80;
      c[3] = bVar1 & 0x3f | 0x80;
    }
  }
  return true;
}

Assistant:

bool Utf8Proc::CodepointToUtf8(int cp, int &sz, char *c) {
	if (cp <= 0x7F) {
		sz = 1;
		c[0] = cp;
	} else if (cp <= 0x7FF) {
		sz = 2;
		c[0] = (cp >> 6) + 192;
		c[1] = (cp & 63) + 128;
	} else if (0xd800 <= cp && cp <= 0xdfff) {
		sz = -1;
		// invalid block of utf
		return false;
	} else if (cp <= 0xFFFF) {
		sz = 3;
		c[0] = (cp >> 12) + 224;
		c[1] = ((cp >> 6) & 63) + 128;
		c[2] = (cp & 63) + 128;
	} else if (cp <= 0x10FFFF) {
		sz = 4;
		c[0] = (cp >> 18) + 240;
		c[1] = ((cp >> 12) & 63) + 128;
		c[2] = ((cp >> 6) & 63) + 128;
		c[3] = (cp & 63) + 128;
	} else {
		sz = -1;
		return false;
	}
	return true;
}